

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_gradient_h_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color left,rf_color right,
          rf_color *dst,rf_int dst_size)

{
  uchar *puVar1;
  long lVar2;
  uchar *puVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < width) {
      puVar1 = &dst->a;
      lVar2 = 0;
      do {
        if (0 < height) {
          fVar5 = (float)lVar2 / (float)width;
          fVar6 = 1.0 - fVar5;
          puVar3 = puVar1;
          lVar4 = (long)height;
          do {
            ((rf_color *)(puVar3 + -3))->r =
                 (uchar)(int)((float)((uint)right & 0xff) * fVar5 +
                             fVar6 * (float)((uint)left & 0xff));
            puVar3[-2] = (uchar)(int)((float)((uint)right >> 8 & 0xff) * fVar5 +
                                     fVar6 * (float)((uint)left >> 8 & 0xff));
            puVar3[-1] = (uchar)(int)((float)((uint)right >> 0x10 & 0xff) * fVar5 +
                                     fVar6 * (float)((uint)left >> 0x10 & 0xff));
            *puVar3 = (uchar)(int)(fVar5 * (float)((uint)right >> 0x18) +
                                  fVar6 * (float)((uint)left >> 0x18));
            puVar3 = puVar3 + (long)width * 4;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
        lVar2 = lVar2 + 1;
        puVar1 = puVar1 + 4;
      } while (lVar2 != width);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_h_to_buffer(int width, int height, rf_color left, rf_color right, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int i = 0; i < width; i++)
        {
            float factor = ((float)i) / ((float)width);

            for (rf_int j = 0; j < height; j++)
            {
                ((rf_color*)dst)[j * width + i].r = (int)((float)right.r * factor + (float)left.r * (1.f - factor));
                ((rf_color*)dst)[j * width + i].g = (int)((float)right.g * factor + (float)left.g * (1.f - factor));
                ((rf_color*)dst)[j * width + i].b = (int)((float)right.b * factor + (float)left.b * (1.f - factor));
                ((rf_color*)dst)[j * width + i].a = (int)((float)right.a * factor + (float)left.a * (1.f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true
        };
    }

    return result;
}